

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O1

Float pbrt::SampleCatmullRom
                (span<const_float> nodes,span<const_float> f,span<const_float> F,Float u,Float *fval
                ,Float *pdf)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  bool bVar10;
  byte bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  long lVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  ulong uVar22;
  ulong uVar23;
  int iVar24;
  uint uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  float fVar35;
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 auVar39 [64];
  size_t vb;
  size_t va;
  
  va = nodes.n;
  pfVar20 = nodes.ptr;
  uVar22 = F.n;
  pfVar21 = F.ptr;
  vb = f.n;
  pfVar19 = f.ptr;
  if (va != vb) {
    LogFatal<char_const(&)[13],char_const(&)[9],char_const(&)[13],unsigned_long&,char_const(&)[9],unsigned_long&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling.cpp"
               ,0x180,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [13])"nodes.size()",
               (char (*) [9])0x98b264,(char (*) [13])"nodes.size()",&va,(char (*) [9])0x98b264,&vb);
  }
  if (vb != uVar22) {
    va = vb;
    vb = uVar22;
    LogFatal<char_const(&)[9],char_const(&)[9],char_const(&)[9],unsigned_long&,char_const(&)[9],unsigned_long&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling.cpp"
               ,0x181,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [9])0x98b264,
               (char (*) [9])"F.size()",(char (*) [9])0x98b264,&va,(char (*) [9])"F.size()",&vb);
  }
  uVar16 = uVar22 - 2;
  lVar18 = 1;
  uVar23 = uVar16;
  while (uVar15 = uVar23, 0 < (long)uVar15) {
    uVar23 = uVar15 >> 1;
    if (pfVar21[(int)uVar23 + (int)lVar18] <= u * pfVar21[uVar22 - 1]) {
      lVar18 = uVar23 + 1 + lVar18;
      uVar23 = ~uVar23 + uVar15;
    }
  }
  if (lVar18 - 1U < uVar16) {
    uVar16 = lVar18 - 1U;
  }
  uVar23 = 0;
  if (0 < lVar18) {
    uVar23 = uVar16;
  }
  iVar24 = (int)uVar23;
  fVar1 = pfVar20[iVar24];
  lVar18 = (long)((uVar23 << 0x20) + 0x100000000) >> 0x1e;
  fVar34 = *(float *)((long)pfVar20 + lVar18);
  fVar2 = pfVar19[iVar24];
  fVar3 = *(float *)((long)pfVar19 + lVar18);
  fVar5 = fVar34 - fVar1;
  if (iVar24 < 1) {
    fVar34 = fVar3 - fVar2;
  }
  else {
    fVar34 = (fVar5 * (fVar3 - pfVar19[iVar24 - 1U])) / (fVar34 - pfVar20[iVar24 - 1U]);
  }
  uVar16 = (long)((uVar23 << 0x20) + 0x200000000) >> 0x20;
  if (uVar16 < va) {
    fVar36 = (fVar5 * (pfVar19[uVar16] - fVar2)) / (pfVar20[uVar16] - fVar1);
  }
  else {
    fVar36 = fVar3 - fVar2;
  }
  fVar35 = (u * pfVar21[uVar22 - 1] - pfVar21[iVar24]) / fVar5;
  fVar4 = fVar34 * 0.5;
  auVar14 = vfmsub231ss_fma(ZEXT416((uint)fVar36),ZEXT416((uint)fVar34),ZEXT416(0xc0000000));
  auVar12 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3eaaaaab),0),auVar14,ZEXT416((uint)fVar3));
  fVar6 = auVar12._0_4_ - fVar2;
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)((fVar2 - fVar3) * 0.5)),ZEXT416((uint)(fVar36 + fVar34)),
                            ZEXT416(0x3e800000));
  auVar29 = ZEXT816(0) << 0x20;
  auVar12 = vfmadd213ss_fma(ZEXT816(0) << 0x40,auVar13,ZEXT416((uint)fVar6));
  auVar12 = vfmadd213ss_fma(auVar12,auVar29,ZEXT416((uint)fVar4));
  auVar33 = ZEXT416((uint)fVar2);
  auVar12 = vfmadd213ss_fma(auVar12,auVar29,auVar33);
  auVar28 = vfmadd213ss_fma(auVar12,auVar29,auVar29);
  auVar12 = vfmadd132ss_fma(ZEXT416((uint)(fVar3 - fVar2)),auVar14,ZEXT416(0x40400000));
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar36 + fVar34)),ZEXT416((uint)(fVar2 - fVar3)),
                            ZEXT416(0x40000000));
  fVar3 = auVar28._0_4_ - fVar35;
  auVar28 = ZEXT416((uint)(auVar14._0_4_ + auVar12._0_4_ + fVar34 + fVar2));
  auVar26._8_4_ = 0x7fffffff;
  auVar26._0_8_ = 0x7fffffff7fffffff;
  auVar26._12_4_ = 0x7fffffff;
  auVar26 = vandps_avx512vl(ZEXT416((uint)fVar3),auVar26);
  if (1e-06 <= auVar26._0_4_) {
    fVar2 = (auVar13._0_4_ + fVar6 + fVar4 + fVar2 + 0.0) - fVar35;
    auVar29._8_4_ = 0x7fffffff;
    auVar29._0_8_ = 0x7fffffff7fffffff;
    auVar29._12_4_ = 0x7fffffff;
    auVar26 = vandps_avx512vl(ZEXT416((uint)fVar2),auVar29);
    if (1e-06 <= auVar26._0_4_) {
      auVar37 = ZEXT816(0);
      auVar26 = vsubss_avx512f(auVar37,ZEXT416((uint)(fVar3 / (fVar2 - fVar3))));
      auVar39 = ZEXT464(0x3f800000);
      uVar7 = vcmpps_avx512vl(ZEXT416((uint)fVar3),auVar37,1);
      auVar38._8_4_ = 0x7fffffff;
      auVar38._0_8_ = 0x7fffffff7fffffff;
      auVar38._12_4_ = 0x7fffffff;
      auVar27 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
      do {
        auVar28 = vaddss_avx512f(auVar39._0_16_,auVar27);
        fVar2 = auVar28._0_4_ * 0.5;
        uVar9 = vcmpss_avx512f(auVar26,auVar39._0_16_,1);
        bVar17 = (bool)((byte)uVar9 & 1);
        uVar9 = vcmpss_avx512f(auVar27,auVar26,1);
        bVar10 = (bool)((byte)uVar9 & 1);
        uVar25 = (uint)bVar10 * ((uint)bVar17 * auVar26._0_4_ + (uint)!bVar17 * (int)fVar2) +
                 (uint)!bVar10 * (int)fVar2;
        auVar26 = ZEXT416(uVar25);
        auVar28 = vfmadd213ss_avx512f(auVar13,auVar26,ZEXT416((uint)fVar6));
        auVar28 = vfmadd213ss_avx512f(auVar28,auVar26,ZEXT416((uint)fVar4));
        auVar28 = vfmadd213ss_avx512f(auVar28,auVar26,auVar33);
        auVar29 = vfmadd213ss_avx512f(auVar28,auVar26,auVar37);
        auVar28 = vfmadd213ss_fma(auVar14,auVar26,auVar12);
        auVar28 = vfmadd213ss_fma(auVar28,auVar26,ZEXT416((uint)fVar34));
        auVar28 = vfmadd213ss_fma(auVar28,auVar26,auVar33);
        auVar29 = vsubss_avx512f(auVar29,ZEXT416((uint)fVar35));
        uVar9 = vcmpps_avx512vl(auVar29,auVar37,5);
        bVar11 = (byte)uVar7 ^ (byte)uVar9;
        auVar30 = ZEXT416((uint)(bVar11 & 1) * auVar39._0_4_ + !(bool)(bVar11 & 1) * uVar25);
        auVar27._0_4_ = (bVar11 & 1) * uVar25 + (uint)!(bool)(bVar11 & 1) * auVar27._0_4_;
        auVar31 = vsubss_avx512f(auVar30,auVar27);
        auVar32 = vandps_avx512vl(auVar29,auVar38);
        uVar9 = vcmpps_avx512vl(auVar32,SUB6416(ZEXT464(0x358637bd),0),5);
        uVar8 = vcmpps_avx512vl(auVar31,SUB6416(ZEXT464(0x358637bd),0),5);
        bVar17 = (bool)((byte)uVar9 & (byte)uVar8 & 1);
        auVar29 = vdivss_avx512f(auVar29,auVar28);
        auVar26 = vsubss_avx512f(auVar26,auVar29);
        auVar26 = ZEXT416((uint)bVar17 * auVar26._0_4_ + !bVar17 * uVar25);
        auVar29 = ZEXT416((uint)bVar17 * in_ZMM17._0_4_ + !bVar17 * uVar25);
        auVar39 = ZEXT1664(auVar30);
        in_ZMM17 = ZEXT1664(auVar29);
      } while (bVar17 != false);
    }
    else {
      auVar29 = SUB6416(ZEXT464(0x3f800000),0);
    }
  }
  if (fval != (Float *)0x0) {
    *fval = auVar28._0_4_;
  }
  if (pdf != (Float *)0x0) {
    *pdf = auVar28._0_4_ / pfVar21[uVar22 - 1];
  }
  auVar12 = vfmadd213ss_fma(auVar29,ZEXT416((uint)fVar5),ZEXT416((uint)fVar1));
  return auVar12._0_4_;
}

Assistant:

Float SampleCatmullRom(pstd::span<const Float> nodes, pstd::span<const Float> f,
                       pstd::span<const Float> F, Float u, Float *fval, Float *pdf) {
    CHECK_EQ(nodes.size(), f.size());
    CHECK_EQ(f.size(), F.size());
    // Map _u_ to a spline interval by inverting _F_
    u *= F.back();
    int i = FindInterval(F.size(), [&](int i) { return F[i] <= u; });

    // Look up $x_i$ and function values of spline segment _i_
    Float x0 = nodes[i], x1 = nodes[i + 1];
    Float f0 = f[i], f1 = f[i + 1];
    Float width = x1 - x0;

    // Approximate derivatives using finite differences
    Float d0 = (i > 0) ? width * (f1 - f[i - 1]) / (x1 - nodes[i - 1]) : (f1 - f0);
    Float d1 = (i + 2 < nodes.size()) ? width * (f[i + 2] - f0) / (nodes[i + 2] - x0)
                                      : (f1 - f0);

    // Re-scale _u_ for continous spline sampling step
    u = (u - F[i]) / width;

    // Invert definite integral over spline segment
    Float Fhat, fhat;
    auto eval = [&](Float t) -> std::pair<Float, Float> {
        Fhat = EvaluatePolynomial(t, 0, f0, 0.5f * d0,
                                  (1.f / 3.f) * (-2 * d0 - d1) + f1 - f0,
                                  0.25f * (d0 + d1) + 0.5f * (f0 - f1));
        fhat = EvaluatePolynomial(t, f0, d0, -2 * d0 - d1 + 3 * (f1 - f0),
                                  d0 + d1 + 2 * (f0 - f1));
        return {Fhat - u, fhat};
    };
    Float t = NewtonBisection(0, 1, eval);

    if (fval != nullptr)
        *fval = fhat;
    if (pdf != nullptr)
        *pdf = fhat / F.back();
    return x0 + width * t;
}